

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_re.c
# Opt level: O0

int ks_getc(kstream_t *ks)

{
  int iVar1;
  kstream_t *ks_local;
  
  if ((ks->is_eof == 0) || (ks->begin < ks->end)) {
    if (ks->end <= ks->begin) {
      ks->begin = 0;
      iVar1 = gzread(ks->f,ks->buf,0xffff);
      ks->end = iVar1;
      if (ks->end == 0) {
        ks->is_eof = 1;
        return -1;
      }
    }
    iVar1 = ks->begin;
    ks->begin = iVar1 + 1;
    ks_local._4_4_ = (uint)ks->buf[iVar1];
  }
  else {
    ks_local._4_4_ = 0xffffffff;
  }
  return ks_local._4_4_;
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_re(char *input_file, char *aStrRegex, int min, int max, int length, int exclude, int convert, int just_count) {
	gzFile fp;
	int count=0,l;
	int excluded = 0;
	int is_fasta = 0; /* assume fastq */
	kseq_t *seq;

	/* pcre2 variables */
	pcre2_code *re; // the regex object
	PCRE2_SIZE erroroffset;
	int errornumber;

	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp);

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); 
	kseq_rewind(seq); /* rewind to beginning for main loop */

        if (verbose_flag) {
            if (is_fasta)
                fprintf(stderr, "Input is FASTA format\n");
            else
                fprintf(stderr, "Input is FASTQ format\n");
        }

	/* initialize the re */
	re = pcre2_compile(
			aStrRegex,             /* the pattern */
			PCRE2_ZERO_TERMINATED, /* indicates pattern is zero-terminated */
			0,                     /* default options */
			&errornumber,          /* for error num */
			&erroroffset,          /* err offset */
			NULL);                 /* default compile context */

	if (re == NULL) {
		  PCRE2_UCHAR buffer[256];
		  pcre2_get_error_message(errornumber, buffer, sizeof(buffer));
		  fprintf(stderr, "PCRE2 compilation failed at offset %d: %s\n", (int)erroroffset, buffer);
		  exit(EXIT_FAILURE);
	}

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		if (exclude) {
			if (search_header(re, seq->name.s) || search_header(re, seq->comment.s))
				excluded++;
			else {
				/* regex doesn't match, so check size/print */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			}
		} else {
			if (search_header(re, seq->name.s) || search_header(re, seq->comment.s)) {
				/* regex matches so check size/print */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			} else
				excluded++;
		}
	} /* end of seq traversal */

	/* tear down re */
	pcre2_code_free(re); /* free up the re */

	kseq_destroy(seq);
	gzclose(fp); /* done reading file so close */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		fprintf(stdout, "Total excluded: %i\n", excluded);
	}
	return count;
}